

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O3

uint32_t __thiscall
ddd::DictionarySGL<false,_false>::delete_key(DictionarySGL<false,_false> *this,char *key)

{
  bool bVar1;
  uint32_t uVar2;
  Query query;
  Query local_20;
  
  local_20.pos_ = 0;
  local_20.value_ = 0x7fffffff;
  local_20.node_pos_ = 0;
  local_20.is_finished_ = false;
  local_20.key_ = key;
  bVar1 = DaTrie<false,_false,_false>::delete_key
                    ((this->trie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl,
                     &local_20);
  uVar2 = 0xffffffff;
  if (bVar1) {
    this->num_keys_ = this->num_keys_ - 1;
    uVar2 = local_20.value_;
  }
  return uVar2;
}

Assistant:

uint32_t delete_key(const char* key) {
    Query query(key);
    if (!trie_->delete_key(query)) {
      return NOT_FOUND;
    }
    --num_keys_;
    return query.value();
  }